

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.h
# Opt level: O1

float64 float32_to_float64_mips(float32 a,float_status *s)

{
  float64 fVar1;
  double dVar2;
  
  if (((a >> 0x17) + 1 & 0xfe) == 0) {
    if ((a & 0x7fffffff) != 0) {
      fVar1 = soft_float32_to_float64(a,s);
      return fVar1;
    }
    dVar2 = (double)((ulong)(a >> 0x1f) << 0x3f);
  }
  else {
    dVar2 = (double)(float)a;
  }
  return (float64)dVar2;
}

Assistant:

static inline bool float32_is_normal(float32 a)
{
    return (((float32_val(a) >> 23) + 1) & 0xff) >= 2;
}